

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  char *pcVar1;
  _Bool _Var2;
  vm *v;
  wasm_reader *wr;
  module *m;
  long lVar3;
  char *in_RDI;
  
  init_opNames();
  init_op();
  _Var2 = stack_test();
  if (_Var2) {
    v = createVM();
    wr = createWasmReader();
    m = createModule("/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/js/ch01_hw.wasm");
    decode_module(wr,m);
    wcasm_objdump(m);
    exec(v,m);
    free_module(wr,m);
    destroy_wasm_reader(wr);
    destroyVM(v);
    return 0;
  }
  main_cold_1();
  lVar3 = 1;
  if (*in_RDI < '\0') {
    lVar3 = 1;
    do {
      pcVar1 = in_RDI + lVar3;
      lVar3 = lVar3 + 1;
    } while (*pcVar1 < '\0');
  }
  return (int)lVar3;
}

Assistant:

int main() {
    INIT_MAIN();
    if (!stack_test()) {
        errorExit("stack op wrong\n");
    }
    const char *filename = "/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/rust/examples/target/wasm32-unknown-unknown/release/ch01_hw.wasm";
    filename = "/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/js/ch01_hw.wasm";
//    filename = "/home/kingdo/go/src/github.com/Kingdo777/wasmgo-book/code/wat/ch09_calc.wasm";

    vm *v = createVM();
    wasm_reader *wr = createWasmReader();
    module *m = createModule(filename);

    decode_module(wr, m);
#ifdef DUMP_SEGMENT
    wcasm_objdump(m);
#endif
    exec(v, m);

    free_module(wr, m);
    destroy_wasm_reader(wr);
    destroyVM(v);
    return 0;
}